

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_SwapWithOther_Test::TestBody
          (GeneratedMessageTest_SwapWithOther_Test *this)

{
  SooRep *pSVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  ArenaStringPtr AVar5;
  int *piVar6;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar7;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar8;
  Nonnull<const_char_*> pcVar9;
  Arena *pAVar10;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar11;
  pointer pcVar12;
  string_view value;
  string_view src;
  string_view value_00;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_6;
  AssertHelper local_6e0;
  undefined1 local_6d8 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_6d0;
  undefined1 local_6c8 [20];
  int local_6b4;
  undefined1 local_6b0 [240];
  RepeatedPtrFieldBase local_5c0 [3];
  RepeatedPtrFieldBase local_578 [3];
  anon_union_16_2_b9f6da03_for_SooRep_0 local_530 [7];
  ArenaStringPtr local_4b8 [26];
  Cord local_3e8 [7];
  undefined1 local_370 [240];
  RepeatedPtrFieldBase local_280 [3];
  RepeatedPtrFieldBase local_238 [3];
  anon_union_16_2_b9f6da03_for_SooRep_0 local_1f0 [7];
  ArenaStringPtr local_178 [26];
  Cord local_a8 [7];
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_370,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_6b0,(Arena *)0x0);
  local_178[0xc].tagged_ptr_.ptr_._0_4_ = 0x7b;
  local_370._16_4_ = local_370._16_4_ | 0x1001;
  pAVar10 = (Arena *)local_370._8_8_;
  if ((local_370._8_8_ & 1) != 0) {
    pAVar10 = *(Arena **)(local_370._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "abc";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(local_178,value,pAVar10);
  local_370._16_4_ = local_370._16_4_ | 0x20;
  if (local_178[5].tagged_ptr_.ptr_ == (void *)0x0) {
    pAVar10 = (Arena *)local_370._8_8_;
    if ((local_370._8_8_ & 1) != 0) {
      pAVar10 = *(Arena **)(local_370._8_8_ & 0xfffffffffffffffe);
    }
    local_178[5].tagged_ptr_.ptr_ =
         (TaggedStringPtr)
         Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(pAVar10);
  }
  (((anon_union_12_1_493b367e_for_TestAllTypes_NestedMessage_3 *)
   ((long)local_178[5].tagged_ptr_.ptr_ + 0x10))->_impl_).bb_ = 1;
  *(byte *)((long)local_178[5].tagged_ptr_.ptr_ + 0x10) =
       *(byte *)((long)local_178[5].tagged_ptr_.ptr_ + 0x10) | 1;
  bVar2 = protobuf::internal::ValidateEnum
                    (1,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (!bVar2) {
LAB_00a57cbb:
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypes_NestedEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.h"
                  ,0xb4d7,
                  "void proto2_unittest::TestAllTypes::_internal_set_optional_nested_enum(::proto2_unittest::TestAllTypes_NestedEnum)"
                 );
  }
  local_178[0x15].tagged_ptr_.ptr_._0_4_ = 1;
  local_370._16_4_ = local_370._16_4_ | 0x82000000;
  src._M_str = "bytes cord";
  src._M_len = 10;
  absl::lts_20250127::Cord::operator=(local_a8,src);
  pSVar1 = (SooRep *)(local_370 + 0x20);
  RepeatedField<int>::Add((RepeatedField<int> *)pSVar1,1);
  RepeatedField<int>::Add((RepeatedField<int> *)pSVar1,2);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[2]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_280,(char (*) [2])0x12820b7);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[2]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_280,(char (*) [2])0x128240e);
  pvVar4 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_238,Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>
                     );
  *(undefined4 *)((long)pvVar4 + 0x18) = 7;
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
  pvVar4 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_238,Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>
                     );
  *(undefined4 *)((long)pvVar4 + 0x18) = 8;
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
  bVar2 = protobuf::internal::ValidateEnum
                    (1,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (!bVar2) {
LAB_00a57c6d:
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypes_NestedEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.h"
                  ,0xba9d,
                  "void proto2_unittest::TestAllTypes::add_repeated_nested_enum(::proto2_unittest::TestAllTypes_NestedEnum)"
                 );
  }
  RepeatedField<int>::Add((RepeatedField<int> *)&local_1f0[0].long_rep,1);
  bVar2 = protobuf::internal::ValidateEnum
                    (2,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (!bVar2) goto LAB_00a57c6d;
  RepeatedField<int>::Add((RepeatedField<int> *)&local_1f0[0].long_rep,2);
  local_4b8[0xc].tagged_ptr_.ptr_._0_4_ = 0x1c8;
  local_6b0._16_4_ = local_6b0._16_4_ | 0x1001;
  pAVar10 = (Arena *)local_6b0._8_8_;
  if ((local_6b0._8_8_ & 1) != 0) {
    pAVar10 = *(Arena **)(local_6b0._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "def";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(local_4b8,value_00,pAVar10);
  local_6b0._16_4_ = local_6b0._16_4_ | 0x20;
  if (local_4b8[5].tagged_ptr_.ptr_ == (void *)0x0) {
    pAVar10 = (Arena *)local_6b0._8_8_;
    if ((local_6b0._8_8_ & 1) != 0) {
      pAVar10 = *(Arena **)(local_6b0._8_8_ & 0xfffffffffffffffe);
    }
    local_4b8[5].tagged_ptr_.ptr_ =
         (TaggedStringPtr)
         Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(pAVar10);
  }
  (((anon_union_12_1_493b367e_for_TestAllTypes_NestedMessage_3 *)
   ((long)local_4b8[5].tagged_ptr_.ptr_ + 0x10))->_impl_).bb_ = 2;
  *(byte *)((long)local_4b8[5].tagged_ptr_.ptr_ + 0x10) =
       *(byte *)((long)local_4b8[5].tagged_ptr_.ptr_ + 0x10) | 1;
  bVar2 = protobuf::internal::ValidateEnum
                    (2,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (!bVar2) goto LAB_00a57cbb;
  local_4b8[0x15].tagged_ptr_.ptr_._0_4_ = 2;
  local_6b0._16_4_ = local_6b0._16_4_ | 0x82000000;
  src_00._M_str = "bytes cord";
  src_00._M_len = 10;
  absl::lts_20250127::Cord::operator=(local_3e8,src_00);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_6b0 + 0x20),3);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[2]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_5c0,(char (*) [2])0x121fc8d);
  pvVar4 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_578,Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>
                     );
  *(undefined4 *)((long)pvVar4 + 0x18) = 9;
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
  bVar2 = protobuf::internal::ValidateEnum
                    (3,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (!bVar2) goto LAB_00a57c6d;
  RepeatedField<int>::Add((RepeatedField<int> *)&local_530[0].long_rep,3);
  if ((local_370._8_8_ & 1) != 0) {
    local_370._8_8_ = *(long *)(local_370._8_8_ & 0xfffffffffffffffe);
  }
  if ((local_6b0._8_8_ & 1) != 0) {
    local_6b0._8_8_ = *(undefined8 *)(local_6b0._8_8_ & 0xfffffffffffffffe);
  }
  if (local_370._8_8_ == local_6b0._8_8_) {
    proto2_unittest::TestAllTypes::InternalSwap((TestAllTypes *)local_370,(TestAllTypes *)local_6b0)
    ;
  }
  else {
    protobuf::internal::GenericSwap((Message *)local_370,(Message *)local_6b0);
  }
  local_6c8._0_4_ = 0x1c8;
  local_6e0.data_._0_4_ = local_178[0xc].tagged_ptr_.ptr_._0_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_6d8,"456","message1.optional_int32()",(int *)local_6c8,
             (int *)&local_6e0);
  if (local_6d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6c8);
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl ==
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      pcVar11 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar11 = *(char **)local_6d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1c6,pcVar11);
    testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
    }
  }
  if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_6d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_6d0._M_head_impl);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_6d8,"\"def\"","message1.optional_string()",(char (*) [4])0x12d5c64,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_178[0].tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_6d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6c8);
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl ==
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      pcVar11 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar11 = *(char **)local_6d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1c7,pcVar11);
    testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
    }
  }
  if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_6d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_6d0._M_head_impl);
  }
  local_6c8._0_4_ = TestAllTypes_NestedEnum_BAR;
  AVar5.tagged_ptr_.ptr_ = (TaggedStringPtr)(TaggedStringPtr)local_178[5];
  if (local_178[5].tagged_ptr_.ptr_ == (void *)0x0) {
    AVar5.tagged_ptr_.ptr_ =
         (TaggedStringPtr)&proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  local_6e0.data_._0_4_ =
       (((TestAllTypes_NestedMessage *)AVar5.tagged_ptr_.ptr_)->field_0)._impl_.bb_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_6d8,"2","message1.optional_nested_message().bb()",(int *)local_6c8,
             (int *)&local_6e0);
  if (local_6d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6c8);
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl ==
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      pcVar11 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar11 = *(char **)local_6d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1c8,pcVar11);
    testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
    }
  }
  if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_6d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_6d0._M_head_impl);
  }
  local_6c8._0_4_ = local_178[0x15].tagged_ptr_.ptr_._0_4_;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
            ((internal *)local_6d8,"::proto2_unittest::TestAllTypes::BAR",
             "message1.optional_nested_enum()",&proto2_unittest::TestAllTypes::BAR,
             (TestAllTypes_NestedEnum *)local_6c8);
  if (local_6d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6c8);
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl ==
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      pcVar11 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar11 = *(char **)local_6d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1c9,pcVar11);
    testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
    }
  }
  if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_6d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_6d0._M_head_impl);
  }
  src_01._M_str = "bytes cord";
  src_01._M_len = 10;
  absl::lts_20250127::Cord::Cord((Cord *)local_6c8,src_01,kConstructorString);
  testing::internal::CmpHelperEQ<absl::lts_20250127::Cord,absl::lts_20250127::Cord>
            ((internal *)local_6d8,"absl::Cord(\"bytes cord\")","message1.optional_bytes_cord()",
             (Cord *)local_6c8,local_a8);
  absl::lts_20250127::Cord::~Cord((Cord *)local_6c8);
  if (local_6d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6c8);
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl ==
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      pcVar11 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar11 = *(char **)local_6d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1ca,pcVar11);
    testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
    }
  }
  if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_6d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_6d0._M_head_impl);
  }
  local_6c8._0_4_ = TestAllTypes_NestedEnum_FOO;
  local_6e0.data_._0_4_ = protobuf::internal::SooRep::size(pSVar1,(local_370[0x20] & 4) == 0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_6d8,"1","message1.repeated_int32_size()",(int *)local_6c8,
             (int *)&local_6e0);
  if (local_6d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6c8);
    if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl == (LogMessageData *)0x0) {
      pcVar11 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar11 = *(char **)local_6d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1cb,pcVar11);
    testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
    goto LAB_00a57a1d;
  }
  if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_6d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_6d0._M_head_impl);
  }
  local_6e0.data_._0_4_ = 3;
  iVar3 = protobuf::internal::SooRep::size(pSVar1,(local_370[0x20] & 4) == 0);
  if (iVar3 < 1) {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)iVar3,"index < size()");
  }
  else {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar9 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_6d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x32c,pcVar9);
    goto LAB_00a57cf3;
  }
  piVar6 = RepeatedField<int>::elements((RepeatedField<int> *)pSVar1,(local_370[0x20] & 4) == 0);
  local_6b4 = *piVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_6c8,"3","message1.repeated_int32(0)",(int *)&local_6e0,&local_6b4);
  if (local_6c8[0] == ~TestAllTypes_NestedEnum_NEG) {
    testing::Message::Message((Message *)local_6d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar11 = ((_Alloc_hider *)local_6c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1cc,pcVar11);
    testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6d8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    if ((long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_6c8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_6c8._8_8_);
  }
  local_6c8._0_4_ = TestAllTypes_NestedEnum_FOO;
  local_6e0.data_._0_4_ = local_280[0].current_size_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_6d8,"1","message1.repeated_string_size()",(int *)local_6c8,
             (int *)&local_6e0);
  if (local_6d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6c8);
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl ==
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      pcVar11 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar11 = *(char **)local_6d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1cd,pcVar11);
    testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
LAB_00a57a1d:
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
    }
    if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl ==
        (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0)
    goto LAB_00a57a4b;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_6d0;
    local_6c8._8_8_ = local_6d0._M_head_impl;
  }
  else {
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(local_280,0);
    testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
              ((internal *)local_6d8,"\"c\"","message1.repeated_string(0)",(char (*) [2])0x121fc8d,
               pVVar7);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1ce,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = TestAllTypes_NestedEnum_FOO;
    local_6e0.data_._0_4_ = local_238[0].current_size_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"1","message1.repeated_nested_message_size()",(int *)local_6c8,
               (int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
          local_6d0._M_head_impl ==
          (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
          0x0) {
        pcVar12 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar12 = (pointer)((local_6d0._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1cf,pcVar12);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      goto LAB_00a57a1d;
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = 9;
    pVVar8 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                       (local_238,0);
    local_6e0.data_._0_4_ = (pVVar8->field_0)._impl_.bb_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"9","message1.repeated_nested_message(0).bb()",(int *)local_6c8
               ,(int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d0,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = TestAllTypes_NestedEnum_FOO;
    local_6e0.data_._0_4_ =
         protobuf::internal::SooRep::size
                   ((SooRep *)&local_1f0[0].long_rep,
                    ((undefined1)local_1f0[0].long_rep.elements_int & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"1","message1.repeated_nested_enum_size()",(int *)local_6c8,
               (int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl == (LogMessageData *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d1,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      goto LAB_00a57a1d;
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    iVar3 = protobuf::internal::SooRep::size
                      ((SooRep *)&local_1f0[0].long_rep,
                       ((undefined1)local_1f0[0].long_rep.elements_int & 4) == 0);
    if (iVar3 < 1) {
      pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)iVar3,"index < size()");
    }
    else {
      pcVar9 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar9 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_6d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar9);
      goto LAB_00a57cf3;
    }
    piVar6 = RepeatedField<int>::elements
                       ((RepeatedField<int> *)&local_1f0[0].long_rep,
                        ((undefined1)local_1f0[0].long_rep.elements_int & 4) == 0);
    local_6e0.data_._0_4_ = *piVar6;
    testing::internal::
    CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
              ((internal *)local_6c8,"::proto2_unittest::TestAllTypes::BAZ",
               "message1.repeated_nested_enum(0)",&proto2_unittest::TestAllTypes::BAZ,
               (TestAllTypes_NestedEnum *)&local_6e0);
    pSVar1 = (SooRep *)(local_6b0 + 0x20);
    if (local_6c8[0] == ~TestAllTypes_NestedEnum_NEG) {
      testing::Message::Message((Message *)local_6d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = ((_Alloc_hider *)local_6c8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d2,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_6c8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6c8._8_8_);
    }
    local_6c8._0_4_ = 0x7b;
    local_6e0.data_._0_4_ = local_4b8[0xc].tagged_ptr_.ptr_._0_4_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"123","message2.optional_int32()",(int *)local_6c8,
               (int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d4,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)local_6d8,"\"abc\"","message2.optional_string()",(char (*) [4])"abc",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)local_4b8[0].tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d5,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = TestAllTypes_NestedEnum_FOO;
    AVar5.tagged_ptr_.ptr_ = (TaggedStringPtr)(TaggedStringPtr)local_4b8[5];
    if (local_4b8[5].tagged_ptr_.ptr_ == (void *)0x0) {
      AVar5.tagged_ptr_.ptr_ =
           (TaggedStringPtr)&proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
    }
    local_6e0.data_._0_4_ =
         (((TestAllTypes_NestedMessage *)AVar5.tagged_ptr_.ptr_)->field_0)._impl_.bb_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"1","message2.optional_nested_message().bb()",(int *)local_6c8,
               (int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d6,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = local_4b8[0x15].tagged_ptr_.ptr_._0_4_;
    testing::internal::
    CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
              ((internal *)local_6d8,"::proto2_unittest::TestAllTypes::FOO",
               "message2.optional_nested_enum()",&proto2_unittest::TestAllTypes::FOO,
               (TestAllTypes_NestedEnum *)local_6c8);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d7,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    src_02._M_str = "bytes cord";
    src_02._M_len = 10;
    absl::lts_20250127::Cord::Cord((Cord *)local_6c8,src_02,kConstructorString);
    testing::internal::CmpHelperEQ<absl::lts_20250127::Cord,absl::lts_20250127::Cord>
              ((internal *)local_6d8,"absl::Cord(\"bytes cord\")","message2.optional_bytes_cord()",
               (Cord *)local_6c8,local_3e8);
    absl::lts_20250127::Cord::~Cord((Cord *)local_6c8);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d8,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = TestAllTypes_NestedEnum_BAR;
    local_6e0.data_._0_4_ = protobuf::internal::SooRep::size(pSVar1,(local_6b0[0x20] & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"2","message2.repeated_int32_size()",(int *)local_6c8,
               (int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl == (LogMessageData *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1d9,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      goto LAB_00a57a1d;
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6e0.data_._0_4_ = 1;
    iVar3 = protobuf::internal::SooRep::size(pSVar1,(local_6b0[0x20] & 4) == 0);
    if (iVar3 < 1) {
      pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)iVar3,"index < size()");
    }
    else {
      pcVar9 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar9 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_6d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar9);
LAB_00a57cf3:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_6d8);
    }
    piVar6 = RepeatedField<int>::elements((RepeatedField<int> *)pSVar1,(local_6b0[0x20] & 4) == 0);
    local_6b4 = *piVar6;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6c8,"1","message2.repeated_int32(0)",(int *)&local_6e0,&local_6b4);
    if (local_6c8[0] == ~TestAllTypes_NestedEnum_NEG) {
      testing::Message::Message((Message *)local_6d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = ((_Alloc_hider *)local_6c8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1da,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_6c8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6c8._8_8_);
    }
    local_6e0.data_._0_4_ = 2;
    iVar3 = protobuf::internal::SooRep::size(pSVar1,(local_6b0[0x20] & 4) == 0);
    if (iVar3 < 2) {
      pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,(long)iVar3,"index < size()");
    }
    else {
      pcVar9 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar9 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_6d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar9);
      goto LAB_00a57cf3;
    }
    piVar6 = RepeatedField<int>::elements((RepeatedField<int> *)pSVar1,(local_6b0[0x20] & 4) == 0);
    local_6b4 = piVar6[1];
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6c8,"2","message2.repeated_int32(1)",(int *)&local_6e0,&local_6b4);
    if (local_6c8[0] == ~TestAllTypes_NestedEnum_NEG) {
      testing::Message::Message((Message *)local_6d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = ((_Alloc_hider *)local_6c8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1db,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_6c8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6c8._8_8_);
    }
    local_6c8._0_4_ = TestAllTypes_NestedEnum_BAR;
    local_6e0.data_._0_4_ = local_5c0[0].current_size_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"2","message2.repeated_string_size()",(int *)local_6c8,
               (int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1dc,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      goto LAB_00a57a1d;
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(local_5c0,0);
    testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
              ((internal *)local_6d8,"\"a\"","message2.repeated_string(0)",(char (*) [2])0x12820b7,
               pVVar7);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1dd,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(local_5c0,1);
    testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
              ((internal *)local_6d8,"\"b\"","message2.repeated_string(1)",(char (*) [2])0x128240e,
               pVVar7);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if (local_6d0._M_head_impl == (LogMessageData *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1de,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = TestAllTypes_NestedEnum_BAR;
    local_6e0.data_._0_4_ = local_578[0].current_size_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"2","message2.repeated_nested_message_size()",(int *)local_6c8,
               (int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if (local_6d0._M_head_impl == (LogMessageData *)0x0) {
        pcVar12 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar12 = (pointer)((local_6d0._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1df,pcVar12);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      goto LAB_00a57a1d;
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = 7;
    pVVar8 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                       (local_578,0);
    local_6e0.data_._0_4_ = (pVVar8->field_0)._impl_.bb_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"7","message2.repeated_nested_message(0).bb()",(int *)local_6c8
               ,(int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if (local_6d0._M_head_impl == (LogMessageData *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1e0,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = 8;
    pVVar8 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                       (local_578,1);
    local_6e0.data_._0_4_ = (pVVar8->field_0)._impl_.bb_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"8","message2.repeated_nested_message(1).bb()",(int *)local_6c8
               ,(int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1e1,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) + 8))();
      }
    }
    if (local_6d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    local_6c8._0_4_ = TestAllTypes_NestedEnum_BAR;
    local_6e0.data_._0_4_ =
         protobuf::internal::SooRep::size
                   ((SooRep *)&local_530[0].long_rep,
                    ((undefined1)local_530[0].long_rep.elements_int & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_6d8,"2","message2.repeated_nested_enum_size()",(int *)local_6c8,
               (int *)&local_6e0);
    if (local_6d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_6c8);
      if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_6d0._M_head_impl == (LogMessageData *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = *(char **)local_6d0._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1e2,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6c8);
      goto LAB_00a57a1d;
    }
    if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
        local_6d0._M_head_impl !=
        (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0)
    {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6d0._M_head_impl);
    }
    iVar3 = protobuf::internal::SooRep::size
                      ((SooRep *)&local_530[0].long_rep,
                       ((undefined1)local_530[0].long_rep.elements_int & 4) == 0);
    if (iVar3 < 1) {
      pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)iVar3,"index < size()");
    }
    else {
      pcVar9 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar9 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_6d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar9);
      goto LAB_00a57cf3;
    }
    piVar6 = RepeatedField<int>::elements
                       ((RepeatedField<int> *)&local_530[0].long_rep,
                        ((undefined1)local_530[0].long_rep.elements_int & 4) == 0);
    local_6e0.data_._0_4_ = *piVar6;
    testing::internal::
    CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
              ((internal *)local_6c8,"::proto2_unittest::TestAllTypes::FOO",
               "message2.repeated_nested_enum(0)",&proto2_unittest::TestAllTypes::FOO,
               (TestAllTypes_NestedEnum *)&local_6e0);
    if (local_6c8[0] == ~TestAllTypes_NestedEnum_NEG) {
      testing::Message::Message((Message *)local_6d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar11 = ((_Alloc_hider *)local_6c8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1e3,pcVar11);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_6c8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_6c8._8_8_);
    }
    iVar3 = protobuf::internal::SooRep::size
                      ((SooRep *)&local_530[0].long_rep,
                       ((undefined1)local_530[0].long_rep.elements_int & 4) == 0);
    if (iVar3 < 2) {
      pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,(long)iVar3,"index < size()");
    }
    else {
      pcVar9 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar9 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_6d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar9);
      goto LAB_00a57cf3;
    }
    piVar6 = RepeatedField<int>::elements
                       ((RepeatedField<int> *)&local_530[0].long_rep,
                        ((undefined1)local_530[0].long_rep.elements_int & 4) == 0);
    local_6e0.data_._0_4_ = piVar6[1];
    testing::internal::
    CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
              ((internal *)local_6c8,"::proto2_unittest::TestAllTypes::BAR",
               "message2.repeated_nested_enum(1)",&proto2_unittest::TestAllTypes::BAR,
               (TestAllTypes_NestedEnum *)&local_6e0);
    if (local_6c8[0] == ~TestAllTypes_NestedEnum_NEG) {
      testing::Message::Message((Message *)local_6d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar12 = ((_Alloc_hider *)local_6c8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1e4,pcVar12);
      testing::internal::AssertHelper::operator=(&local_6e0,(Message *)local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      if ((long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_6d8._1_7_,local_6d8[0]) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00a57a4b;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_6c8 + 8);
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_6c8._8_8_);
LAB_00a57a4b:
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_6b0);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_370);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, SwapWithOther) {
  UNITTEST::TestAllTypes message1, message2;

  message1.set_optional_int32(123);
  message1.set_optional_string("abc");
  message1.mutable_optional_nested_message()->set_bb(1);
  message1.set_optional_nested_enum(UNITTEST::TestAllTypes::FOO);
  message1.set_optional_bytes_cord("bytes cord");
  message1.add_repeated_int32(1);
  message1.add_repeated_int32(2);
  message1.add_repeated_string("a");
  message1.add_repeated_string("b");
  message1.add_repeated_nested_message()->set_bb(7);
  message1.add_repeated_nested_message()->set_bb(8);
  message1.add_repeated_nested_enum(UNITTEST::TestAllTypes::FOO);
  message1.add_repeated_nested_enum(UNITTEST::TestAllTypes::BAR);

  message2.set_optional_int32(456);
  message2.set_optional_string("def");
  message2.mutable_optional_nested_message()->set_bb(2);
  message2.set_optional_nested_enum(UNITTEST::TestAllTypes::BAR);
  message2.set_optional_bytes_cord("bytes cord");
  message2.add_repeated_int32(3);
  message2.add_repeated_string("c");
  message2.add_repeated_nested_message()->set_bb(9);
  message2.add_repeated_nested_enum(UNITTEST::TestAllTypes::BAZ);

  message1.Swap(&message2);

  EXPECT_EQ(456, message1.optional_int32());
  EXPECT_EQ("def", message1.optional_string());
  EXPECT_EQ(2, message1.optional_nested_message().bb());
  EXPECT_EQ(UNITTEST::TestAllTypes::BAR, message1.optional_nested_enum());
  EXPECT_EQ(absl::Cord("bytes cord"), message1.optional_bytes_cord());
  ASSERT_EQ(1, message1.repeated_int32_size());
  EXPECT_EQ(3, message1.repeated_int32(0));
  ASSERT_EQ(1, message1.repeated_string_size());
  EXPECT_EQ("c", message1.repeated_string(0));
  ASSERT_EQ(1, message1.repeated_nested_message_size());
  EXPECT_EQ(9, message1.repeated_nested_message(0).bb());
  ASSERT_EQ(1, message1.repeated_nested_enum_size());
  EXPECT_EQ(UNITTEST::TestAllTypes::BAZ, message1.repeated_nested_enum(0));

  EXPECT_EQ(123, message2.optional_int32());
  EXPECT_EQ("abc", message2.optional_string());
  EXPECT_EQ(1, message2.optional_nested_message().bb());
  EXPECT_EQ(UNITTEST::TestAllTypes::FOO, message2.optional_nested_enum());
  EXPECT_EQ(absl::Cord("bytes cord"), message2.optional_bytes_cord());
  ASSERT_EQ(2, message2.repeated_int32_size());
  EXPECT_EQ(1, message2.repeated_int32(0));
  EXPECT_EQ(2, message2.repeated_int32(1));
  ASSERT_EQ(2, message2.repeated_string_size());
  EXPECT_EQ("a", message2.repeated_string(0));
  EXPECT_EQ("b", message2.repeated_string(1));
  ASSERT_EQ(2, message2.repeated_nested_message_size());
  EXPECT_EQ(7, message2.repeated_nested_message(0).bb());
  EXPECT_EQ(8, message2.repeated_nested_message(1).bb());
  ASSERT_EQ(2, message2.repeated_nested_enum_size());
  EXPECT_EQ(UNITTEST::TestAllTypes::FOO, message2.repeated_nested_enum(0));
  EXPECT_EQ(UNITTEST::TestAllTypes::BAR, message2.repeated_nested_enum(1));
}